

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O3

int lyd_print_fd(int fd,lyd_node *root,LYD_FORMAT format,int options)

{
  int iVar1;
  lyout local_58;
  
  if (fd < 0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_print_fd");
    iVar1 = 1;
  }
  else {
    local_58.type = LYOUT_FD;
    local_58._4_4_ = 0;
    local_58.buf_size = 0;
    local_58.hole_count = 0;
    local_58.buffered = (char *)0x0;
    local_58.buf_len = 0;
    local_58.method.mem.len = 0;
    local_58.method.mem.size = 0;
    local_58.method._4_4_ = 0;
    local_58.method.fd = fd;
    iVar1 = lyd_print_(&local_58,root,format,options);
    free(local_58.buffered);
  }
  return iVar1;
}

Assistant:

API int
lyd_print_fd(int fd, const struct lyd_node *root, LYD_FORMAT format, int options)
{
    int r;
    struct lyout out;

    if (fd < 0) {
        LOGARG;
        return EXIT_FAILURE;
    }

    memset(&out, 0, sizeof out);

    out.type = LYOUT_FD;
    out.method.fd = fd;

    r = lyd_print_(&out, root, format, options);

    free(out.buffered);
    return r;
}